

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helix.cc
# Opt level: O2

helix_protocol_t helix_protocol_lookup(char *name)

{
  bool bVar1;
  nordic_itch_protocol *this;
  string *this_00;
  allocator local_91;
  string local_90;
  string local_70;
  string local_50;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_90,name,&local_91);
  bVar1 = helix::nasdaq::nordic_itch_protocol::supports(&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  if (bVar1) {
    this = (nordic_itch_protocol *)operator_new(0x28);
    std::__cxx11::string::string((string *)&local_30,name,(allocator *)&local_90);
    helix::nasdaq::nordic_itch_protocol::nordic_itch_protocol(this,&local_30);
    this_00 = &local_30;
  }
  else {
    std::__cxx11::string::string((string *)&local_90,name,&local_91);
    bVar1 = helix::nasdaq::itch50_protocol::supports(&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    if (bVar1) {
      this = (nordic_itch_protocol *)operator_new(0x28);
      std::__cxx11::string::string((string *)&local_50,name,(allocator *)&local_90);
      helix::nasdaq::itch50_protocol::itch50_protocol((itch50_protocol *)this,&local_50);
      this_00 = &local_50;
    }
    else {
      std::__cxx11::string::string((string *)&local_90,name,&local_91);
      bVar1 = helix::parity::pmd_protocol::supports(&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      if (!bVar1) {
        return (helix_protocol_t)0x0;
      }
      this = (nordic_itch_protocol *)operator_new(0x28);
      std::__cxx11::string::string((string *)&local_70,name,(allocator *)&local_90);
      helix::parity::pmd_protocol::pmd_protocol((pmd_protocol *)this,&local_70);
      this_00 = &local_70;
    }
  }
  std::__cxx11::string::~string((string *)this_00);
  return (helix_protocol_t)this;
}

Assistant:

helix_protocol_t helix_protocol_lookup(const char *name)
{
    if (helix::nasdaq::nordic_itch_protocol::supports(name)) {
        return wrap(new helix::nasdaq::nordic_itch_protocol{name});
    }
    if (helix::nasdaq::itch50_protocol::supports(name)) {
        return wrap(new helix::nasdaq::itch50_protocol{name});
    }
    if (helix::parity::pmd_protocol::supports(name)) {
        return wrap(new helix::parity::pmd_protocol{name});
    }
    return NULL;
}